

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.cpp
# Opt level: O3

ptr<Integer> __thiscall Array::length(Array *this)

{
  long lVar1;
  long lVar2;
  _func_int **pp_Var3;
  long in_RSI;
  ptr<Integer> pVar4;
  
  lVar1 = (*(long **)(in_RSI + 0x10))[1];
  lVar2 = **(long **)(in_RSI + 0x10);
  pp_Var3 = (_func_int **)operator_new(0x20);
  pp_Var3[1] = (_func_int *)0x100000001;
  *pp_Var3 = (_func_int *)&PTR___Sp_counted_ptr_inplace_0012f560;
  pp_Var3[2] = (_func_int *)&PTR__Member_0012f5b0;
  pp_Var3[3] = (_func_int *)(lVar1 - lVar2 >> 4);
  (this->super_Iterable)._vptr_Iterable = pp_Var3;
  (this->super_Value).super_Member._vptr_Member = pp_Var3 + 2;
  pVar4.super___shared_ptr<Integer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__Member_0012f5b0;
  pVar4.super___shared_ptr<Integer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Integer>)pVar4.super___shared_ptr<Integer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Integer> Array::length() {
    return make<Integer>(values->size());
}